

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O0

int tokthsea1(void *ctx0,toksdef *sym,mcmon objn)

{
  int iVar1;
  void *in_RSI;
  undefined8 *in_RDI;
  tokseadef *ctx;
  
  if ((*(char *)((long)in_RSI + 6) == *(char *)((long)in_RDI + 0xe)) &&
     (iVar1 = memcmp((void *)((long)in_RSI + 7),(void *)*in_RDI,(ulong)*(byte *)((long)in_RDI + 0xe)
                    ), iVar1 == 0)) {
    memcpy((void *)in_RDI[7],in_RSI,(ulong)*(byte *)((long)in_RDI + 0xe) + 8);
    return 1;
  }
  return 0;
}

Assistant:

static int tokthsea1(void *ctx0, toksdef *sym, mcmon objn)
{
    tokseadef *ctx = (tokseadef *)ctx0;
    
    VARUSED(objn);
    
    if (sym->tokslen == ctx->tokseasym.tokslen &&
        !memcmp(sym->toksnam, ctx->tokseanam, ctx->tokseasym.tokslen))
    {
        memcpy(ctx->toksearet, sym,
               (size_t)(sizeof(toks1def) + ctx->tokseasym.tokslen));
        return(TRUE);
    }
    else
        return(FALSE);
}